

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

FieldOptions * __thiscall
google::protobuf::FieldDescriptorProto::mutable_options(FieldDescriptorProto *this)

{
  FieldOptions *this_00;
  FieldDescriptorProto *this_local;
  
  set_has_options(this);
  if (this->options_ == (FieldOptions *)0x0) {
    this_00 = (FieldOptions *)operator_new(0x70);
    FieldOptions::FieldOptions(this_00);
    this->options_ = this_00;
  }
  return this->options_;
}

Assistant:

inline ::google::protobuf::FieldOptions* FieldDescriptorProto::mutable_options() {
  set_has_options();
  if (options_ == NULL) options_ = new ::google::protobuf::FieldOptions;
  return options_;
}